

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_datatype_is_valid(int dtype,int for_nifti)

{
  uint uVar1;
  ulong uVar2;
  
  if (dtype != 1 || for_nifti == 0) {
    uVar2 = 0x2b;
    do {
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
      if (nifti_type_list[uVar2].type == dtype) {
        return 1;
      }
    } while (1 < uVar1);
  }
  return 0;
}

Assistant:

int nifti_datatype_is_valid( int dtype, int for_nifti )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    /* special case */
    if( for_nifti && dtype == DT_BINARY ) return 0;

    for( c = tablen-1; c > 0; c-- )
        if( nifti_type_list[c].type == dtype )
            return 1;

    return 0;
}